

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O2

void de::cmdline::detail::dispatchSetDefault<tcu::opt::TestOOM>(TypedFieldMap *dst)

{
  bool *dst_00;
  
  dst_00 = (bool *)operator_new(1);
  *dst_00 = false;
  getTypeDefault<bool>(dst_00);
  TypedFieldMap::set<tcu::opt::TestOOM>(dst,dst_00);
  return;
}

Assistant:

void dispatchSetDefault (TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		getTypeDefault<typename OptTraits<OptType>::ValueType>(value);
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}